

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

Fl_Help_Link * __thiscall Fl_Help_View::find_link(Fl_Help_View *this,int xx,int yy)

{
  bool bVar1;
  Fl_Help_Link *pFVar2;
  Fl_Help_Link *pFVar3;
  int iVar4;
  
  iVar4 = this->nlinks_;
  pFVar3 = this->links_;
  if (0 < iVar4) {
    do {
      if ((((pFVar3->x <= xx) && (xx < pFVar3->w)) && (pFVar3->y <= yy)) && (yy < pFVar3->h))
      goto LAB_001b656e;
      pFVar3 = pFVar3 + 1;
      bVar1 = 1 < iVar4;
      iVar4 = iVar4 + -1;
    } while (bVar1);
    iVar4 = 0;
  }
LAB_001b656e:
  pFVar2 = (Fl_Help_Link *)0x0;
  if (iVar4 != 0) {
    pFVar2 = pFVar3;
  }
  return pFVar2;
}

Assistant:

Fl_Help_Link *Fl_Help_View::find_link(int xx, int yy)
{
  int		i;
  Fl_Help_Link	*linkp;
  for (i = nlinks_, linkp = links_; i > 0; i --, linkp ++) {
    if (xx >= linkp->x && xx < linkp->w &&
        yy >= linkp->y && yy < linkp->h)
      break;
  }
  return i ? linkp : 0L;
}